

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsd.h
# Opt level: O2

int bsd_accept_socket(int fd,bsd_addr_t *addr)

{
  sa_family_t sVar1;
  int __fd;
  int iVar2;
  uint uVar3;
  long lStack_20;
  
  addr->len = 0x80;
  __fd = accept4(fd,(sockaddr *)addr,&addr->len,0x80800);
  sVar1 = (addr->mem).ss_family;
  if (sVar1 == 10) {
    iVar2 = 0x10;
    lStack_20 = 8;
  }
  else {
    iVar2 = 0;
    if (sVar1 != 2) goto LAB_00105651;
    iVar2 = 4;
    lStack_20 = 4;
  }
  addr->ip = (addr->mem).__ss_padding + lStack_20 + -2;
LAB_00105651:
  addr->ip_length = iVar2;
  uVar3 = fcntl(__fd,3,0);
  fcntl(__fd,4,(ulong)(uVar3 | 0x800));
  return __fd;
}

Assistant:

static inline LIBUS_SOCKET_DESCRIPTOR bsd_accept_socket(LIBUS_SOCKET_DESCRIPTOR fd, struct bsd_addr_t *addr) {
    LIBUS_SOCKET_DESCRIPTOR accepted_fd;
    addr->len = sizeof(addr->mem);

#if defined(SOCK_CLOEXEC) && defined(SOCK_NONBLOCK)
    // Linux, FreeBSD
    accepted_fd = accept4(fd, (struct sockaddr *) addr, &addr->len, SOCK_CLOEXEC | SOCK_NONBLOCK);
#else
    // Windows, OS X
    accepted_fd = accept(fd, (struct sockaddr *) addr, &addr->len);

#endif

    internal_finalize_bsd_addr(addr);

    return bsd_set_nonblocking(apple_no_sigpipe(accepted_fd));
}